

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnicodeCharRanges.h
# Opt level: O0

bool __thiscall llvm::sys::UnicodeCharSet::rangesAreValid(UnicodeCharSet *this)

{
  bool bVar1;
  iterator pUVar2;
  iterator pUVar3;
  raw_ostream *prVar4;
  const_iterator E;
  const_iterator I;
  uint32_t Prev;
  UnicodeCharSet *this_local;
  
  I._4_4_ = 0;
  E = ArrayRef<llvm::sys::UnicodeCharRange>::begin(&this->Ranges);
  pUVar2 = ArrayRef<llvm::sys::UnicodeCharRange>::end(&this->Ranges);
  while( true ) {
    if (E == pUVar2) {
      return true;
    }
    pUVar3 = ArrayRef<llvm::sys::UnicodeCharRange>::begin(&this->Ranges);
    if ((E != pUVar3) && (E->Lower <= I._4_4_)) break;
    if (E->Upper < E->Lower) {
      if (((DebugFlag & 1) != 0) && (bVar1 = isCurrentDebugType("unicode"), bVar1)) {
        prVar4 = dbgs();
        raw_ostream::operator<<(prVar4,"Upper bound 0x");
      }
      if (((DebugFlag & 1) != 0) && (bVar1 = isCurrentDebugType("unicode"), bVar1)) {
        prVar4 = dbgs();
        raw_ostream::write_hex(prVar4,(ulong)E->Lower);
      }
      if (((DebugFlag & 1) != 0) && (bVar1 = isCurrentDebugType("unicode"), bVar1)) {
        prVar4 = dbgs();
        raw_ostream::operator<<(prVar4," should not be less than lower bound 0x");
      }
      if (((DebugFlag & 1) != 0) && (bVar1 = isCurrentDebugType("unicode"), bVar1)) {
        prVar4 = dbgs();
        prVar4 = raw_ostream::write_hex(prVar4,(ulong)E->Upper);
        raw_ostream::operator<<(prVar4,"\n");
      }
      return false;
    }
    I._4_4_ = E->Upper;
    E = E + 1;
  }
  if (((DebugFlag & 1) != 0) && (bVar1 = isCurrentDebugType("unicode"), bVar1)) {
    prVar4 = dbgs();
    raw_ostream::operator<<(prVar4,"Upper bound 0x");
  }
  if (((DebugFlag & 1) != 0) && (bVar1 = isCurrentDebugType("unicode"), bVar1)) {
    prVar4 = dbgs();
    raw_ostream::write_hex(prVar4,(ulong)I._4_4_);
  }
  if (((DebugFlag & 1) != 0) && (bVar1 = isCurrentDebugType("unicode"), bVar1)) {
    prVar4 = dbgs();
    raw_ostream::operator<<(prVar4," should be less than succeeding lower bound 0x");
  }
  if (((DebugFlag & 1) != 0) && (bVar1 = isCurrentDebugType("unicode"), bVar1)) {
    prVar4 = dbgs();
    prVar4 = raw_ostream::write_hex(prVar4,(ulong)E->Lower);
    raw_ostream::operator<<(prVar4,"\n");
  }
  return false;
}

Assistant:

bool rangesAreValid() const {
    uint32_t Prev = 0;
    for (CharRanges::const_iterator I = Ranges.begin(), E = Ranges.end();
         I != E; ++I) {
      if (I != Ranges.begin() && Prev >= I->Lower) {
        LLVM_DEBUG(dbgs() << "Upper bound 0x");
        LLVM_DEBUG(dbgs().write_hex(Prev));
        LLVM_DEBUG(dbgs() << " should be less than succeeding lower bound 0x");
        LLVM_DEBUG(dbgs().write_hex(I->Lower) << "\n");
        return false;
      }
      if (I->Upper < I->Lower) {
        LLVM_DEBUG(dbgs() << "Upper bound 0x");
        LLVM_DEBUG(dbgs().write_hex(I->Lower));
        LLVM_DEBUG(dbgs() << " should not be less than lower bound 0x");
        LLVM_DEBUG(dbgs().write_hex(I->Upper) << "\n");
        return false;
      }
      Prev = I->Upper;
    }

    return true;
  }